

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

int intlog2(int x)

{
  int local_10;
  int local_c;
  int log;
  int x_local;
  
  local_10 = 0;
  local_c = x;
  if (x < 0) {
    local_c = 0;
  }
  for (; 0 < local_c >> ((byte)local_10 & 0x1f); local_10 = local_10 + 1) {
  }
  if ((0 < local_10) && (local_c == 1 << ((byte)local_10 - 1 & 0x1f))) {
    local_10 = local_10 + -1;
  }
  return local_10;
}

Assistant:

int intlog2(int x)
{
    int log = 0;
    if (x < 0) { x = 0; }
    while ((x >> log) > 0)
    {
        log++;
    }
    if (log > 0 && x == 1<<(log-1)) { log--; }
    return log;
}